

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O2

void __thiscall hwtest::pgraph::MthdEmuD3D56TlvY::emulate_mthd(MthdEmuD3D56TlvY *this)

{
  uint32_t *puVar1;
  StateTest *pSVar2;
  byte bVar3;
  
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx[1] =
         (this->super_SingleMthdTest).super_MthdTest.val;
    pSVar2 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest;
    (pSVar2->exp).celsius_pipe_vtx[2] = 0;
    (pSVar2->exp).celsius_pipe_vtx[3] = 0x3f800000;
  }
  puVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid + 1;
  *(byte *)puVar1 = (byte)*puVar1 | 0x10;
  if ((this->super_SingleMthdTest).super_MthdTest.cls == 0x48) {
    bVar3 = (byte)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.misc24[2] & 0xf;
  }
  else {
    bVar3 = (byte)*(undefined4 *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914;
  }
  puVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid;
  *puVar1 = *puVar1 & ~(uint)(1L << (bVar3 & 0x3f));
  return;
}

Assistant:

void emulate_mthd() override {
		if (!extr(exp.nsource, 1, 1)) {
			exp.celsius_pipe_vtx[1] = val;
			exp.celsius_pipe_vtx[2] = 0;
			exp.celsius_pipe_vtx[3] = 0x3f800000;
		}
		insrt(exp.valid[1], 4, 1, 1);
		int vidx = (cls == 0x48 ? extr(exp.misc24[2], 0, 4) : idx);
		insrt(exp.valid[0], vidx, 1, 0);
	}